

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

void on_empty_amqp_frame_received(void *context,uint16_t channel)

{
  int iVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if ((*(byte *)((long)context + 0xe0) & 8) != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_TRACE,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"on_empty_amqp_frame_received",0x326,1,"<- Empty frame");
    }
  }
  iVar1 = tickcounter_get_current_ms
                    (*(TICK_COUNTER_HANDLE *)((long)context + 0x48),
                     (tickcounter_ms_t *)((long)context + 200));
  if (iVar1 != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"on_empty_amqp_frame_received",0x32a,1,"Cannot get tickcounter value");
      return;
    }
  }
  return;
}

Assistant:

static void on_empty_amqp_frame_received(void* context, uint16_t channel)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;
    /* It does not matter on which channel we received the frame */
    (void)channel;

    if (connection->is_trace_on == 1)
    {
        LOG(AZ_LOG_TRACE, LOG_LINE, "<- Empty frame");
    }
    if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_received_time) != 0)
    {
        LogError("Cannot get tickcounter value");
    }
}